

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

void __thiscall CLI::App::_process_config_file(App *this)

{
  Option *this_00;
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  FileError *this_01;
  reference config_file_00;
  byte local_f9;
  bool force;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config_file;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_a8;
  byte local_81;
  undefined1 local_80 [7];
  bool files_used;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  config_files;
  string local_58;
  undefined1 local_38 [8];
  string ename_string;
  bool file_given;
  bool config_required;
  App *this_local;
  
  if (this->config_ptr_ == (Option *)0x0) {
    return;
  }
  ename_string.field_2._M_local_buf[0xf] =
       OptionBase<CLI::Option>::get_required(&this->config_ptr_->super_OptionBase<CLI::Option>);
  sVar2 = Option::count(this->config_ptr_);
  ename_string.field_2._M_local_buf[0xe] = sVar2 != 0;
  if ((!(bool)ename_string.field_2._M_local_buf[0xe]) &&
     (uVar3 = ::std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
    detail::get_environment_value((string *)local_38,&this->config_ptr_->envname_);
    uVar3 = ::std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      this_00 = this->config_ptr_;
      ::std::__cxx11::string::string((string *)&local_58,(string *)local_38);
      Option::add_result(this_00,&local_58);
      ::std::__cxx11::string::~string((string *)&local_58);
    }
    ::std::__cxx11::string::~string((string *)local_38);
  }
  Option::run_callback(this->config_ptr_);
  Option::as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_80,this->config_ptr_);
  local_81 = ename_string.field_2._M_local_buf[0xe] & 1;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_80);
  if (!bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_80);
    uVar3 = ::std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_80);
      config_file = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_80);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&config_file), bVar1) {
        config_file_00 =
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
        local_f9 = 1;
        if ((ename_string.field_2._M_local_buf[0xf] & 1U) == 0) {
          local_f9 = ename_string.field_2._M_local_buf[0xe];
        }
        bVar1 = _process_config_file(this,config_file_00,(bool)(local_f9 & 1));
        if (bVar1) {
          local_81 = 1;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      if ((local_81 & 1) == 0) {
        Option::clear(this->config_ptr_);
        bVar1 = this->config_ptr_->force_callback_;
        this->config_ptr_->force_callback_ = false;
        Option::run_callback(this->config_ptr_);
        this->config_ptr_->force_callback_ = (bool)(bVar1 & 1);
      }
      __range2._0_4_ = 0;
      goto LAB_001adaa5;
    }
  }
  if ((ename_string.field_2._M_local_buf[0xf] & 1U) != 0) {
    __range2._6_1_ = 1;
    this_01 = (FileError *)__cxa_allocate_exception(0x38);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_a8,"config file is required but none was given",
               (allocator *)((long)&__range2 + 7));
    FileError::FileError(this_01,&local_a8);
    __range2._6_1_ = 0;
    __cxa_throw(this_01,&FileError::typeinfo,FileError::~FileError);
  }
  __range2._0_4_ = 1;
LAB_001adaa5:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_80);
  return;
}

Assistant:

CLI11_INLINE void App::_process_config_file() {
    if(config_ptr_ != nullptr) {
        bool config_required = config_ptr_->get_required();
        auto file_given = config_ptr_->count() > 0;
        if(!(file_given || config_ptr_->envname_.empty())) {
            std::string ename_string = detail::get_environment_value(config_ptr_->envname_);
            if(!ename_string.empty()) {
                config_ptr_->add_result(ename_string);
            }
        }
        config_ptr_->run_callback();

        auto config_files = config_ptr_->as<std::vector<std::string>>();
        bool files_used{file_given};
        if(config_files.empty() || config_files.front().empty()) {
            if(config_required) {
                throw FileError("config file is required but none was given");
            }
            return;
        }
        for(const auto &config_file : config_files) {
            if(_process_config_file(config_file, config_required || file_given)) {
                files_used = true;
            }
        }
        if(!files_used) {
            // this is done so the count shows as 0 if no callbacks were processed
            config_ptr_->clear();
            bool force = config_ptr_->force_callback_;
            config_ptr_->force_callback_ = false;
            config_ptr_->run_callback();
            config_ptr_->force_callback_ = force;
        }
    }
}